

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Group.cpp
# Opt level: O2

DataType __thiscall adios2::core::Group::InquireVariableType(Group *this,string *name)

{
  IO *this_00;
  DataType DVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  this_00 = this->m_IO;
  std::operator+(&local_50,&this->currentPath,this->groupDelimiter);
  std::operator+(&local_30,&local_50,name);
  DVar1 = IO::InquireVariableType(this_00,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  return DVar1;
}

Assistant:

DataType Group::InquireVariableType(const std::string &name) const noexcept
{

    return m_IO.InquireVariableType(currentPath + groupDelimiter + name);
}